

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

char * ValidateArrayContents<aiVector3t<float>>
                 (aiVector3D *arr,uint size,vector<bool,_std::allocator<bool>_> *dirtyMask,
                 bool mayBeIdentical,bool mayBeZero)

{
  float fVar1;
  float fVar2;
  float fVar3;
  const_reference cVar4;
  bool bVar5;
  vector<bool,_std::allocator<bool>_> *pvVar6;
  vector<bool,_std::allocator<bool>_> *pvVar7;
  vector<bool,_std::allocator<bool>_> *extraout_RDX;
  vector<bool,_std::allocator<bool>_> *extraout_RDX_00;
  char *pcVar8;
  ulong __n;
  uint uVar9;
  byte bVar10;
  _IEEESingle temp;
  _IEEESingle temp_1;
  _IEEESingle temp_2;
  
  __n = 0;
  bVar10 = 0;
  uVar9 = 0;
  pcVar8 = (char *)dirtyMask;
  do {
    if (size == __n) {
LAB_003b5760:
      pvVar7 = (vector<bool,_std::allocator<bool>_> *)0x0;
      pvVar6 = (vector<bool,_std::allocator<bool>_> *)"All vectors are identical";
      if (mayBeIdentical) {
        pvVar6 = pvVar7;
      }
      if (bVar10 != 0) {
        pvVar6 = pvVar7;
      }
      if (uVar9 < 2) {
        pvVar6 = pvVar7;
      }
      if (__n < size) {
        pvVar6 = (vector<bool,_std::allocator<bool>_> *)pcVar8;
      }
      return (char *)pvVar6;
    }
    if ((((long)(dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
         (long)(dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
         (ulong)(dirtyMask->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset == 0) ||
       (cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](dirtyMask,__n),
       pcVar8 = (char *)extraout_RDX, !cVar4)) {
      uVar9 = uVar9 + 1;
      fVar1 = arr->x;
      if ((0x7f7fffff < (uint)ABS(fVar1)) ||
         ((fVar2 = arr->y, 0x7f7fffff < (uint)ABS(fVar2) ||
          (fVar3 = arr->z, 0x7f7fffff < (uint)ABS(fVar3))))) {
        pcVar8 = "INF/NAN was found in a vector component";
        goto LAB_003b5760;
      }
      if ((((!mayBeZero) && (fVar1 == 0.0)) && (!NAN(fVar1))) &&
         (((fVar2 == 0.0 && (!NAN(fVar2))) && ((fVar3 == 0.0 && (!NAN(fVar3))))))) {
        pcVar8 = "Found zero-length vector";
        goto LAB_003b5760;
      }
      if (__n != 0) {
        bVar5 = aiVector3t<float>::operator!=(arr,arr + -1);
        bVar10 = bVar10 | bVar5;
        pcVar8 = (char *)extraout_RDX_00;
      }
    }
    __n = __n + 1;
    arr = arr + 1;
  } while( true );
}

Assistant:

inline
const char* ValidateArrayContents<aiVector3D>(const aiVector3D* arr, unsigned int size,
        const std::vector<bool>& dirtyMask, bool mayBeIdentical , bool mayBeZero ) {
    bool b = false;
    unsigned int cnt = 0;
    for (unsigned int i = 0; i < size;++i)  {

        if (dirtyMask.size() && dirtyMask[i]) {
            continue;
        }
        ++cnt;

        const aiVector3D& v = arr[i];
        if (is_special_float(v.x) || is_special_float(v.y) || is_special_float(v.z))    {
            return "INF/NAN was found in a vector component";
        }
        if (!mayBeZero && !v.x && !v.y && !v.z )    {
            return "Found zero-length vector";
        }
        if (i && v != arr[i-1])b = true;
    }
    if (cnt > 1 && !b && !mayBeIdentical) {
        return "All vectors are identical";
    }
    return nullptr;
}